

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

void remove_expired(CookieInfo *cookies)

{
  time_t tVar1;
  Cookie *pCVar2;
  Cookie *co;
  Cookie *pCVar3;
  Cookie *pCVar4;
  
  tVar1 = time((time_t *)0x0);
  pCVar2 = cookies->cookies;
  pCVar4 = (Cookie *)0x0;
  do {
    co = pCVar2;
    pCVar3 = pCVar4;
    if (pCVar4 == (Cookie *)0x0) {
      pCVar3 = (Cookie *)cookies;
    }
    while( true ) {
      if (co == (Cookie *)0x0) {
        return;
      }
      pCVar2 = co->next;
      pCVar4 = co;
      if ((co->expires == 0) || (tVar1 <= co->expires)) break;
      pCVar3->next = pCVar2;
      cookies->numcookies = cookies->numcookies + -1;
      freecookie(co);
      co = pCVar2;
    }
  } while( true );
}

Assistant:

static void remove_expired(struct CookieInfo *cookies)
{
  struct Cookie *co, *nx, *pv;
  curl_off_t now = (curl_off_t)time(NULL);

  co = cookies->cookies;
  pv = NULL;
  while(co) {
    nx = co->next;
    if(co->expires && co->expires < now) {
      if(!pv) {
        cookies->cookies = co->next;
      }
      else {
        pv->next = co->next;
      }
      cookies->numcookies--;
      freecookie(co);
    }
    else {
      pv = co;
    }
    co = nx;
  }
}